

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::rebucket_tuples(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *this,vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        *tuples,comm *comm,size_t gl_offset,
                 vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                 *minqueries)

{
  anon_class_24_3_ecf550cb func;
  int iVar1;
  unsigned_long uVar2;
  iterator begin;
  iterator end;
  reference pvVar3;
  bool bVar4;
  ulong local_90;
  size_t i;
  unsigned_long local_80;
  size_t pre_max;
  long local_50;
  size_t local_max;
  long local_40;
  size_t prefix;
  size_t local_size;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *minqueries_local;
  size_t gl_offset_local;
  comm *comm_local;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *tuples_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *this_local;
  
  local_size = (size_t)minqueries;
  minqueries_local =
       (vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        *)gl_offset;
  gl_offset_local = (size_t)comm;
  comm_local = (comm *)tuples;
  tuples_local = (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)this;
  prefix = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size(tuples)
  ;
  uVar2 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&prefix,gl_offset_local);
  local_50 = 0;
  local_40 = (long)&(minqueries_local->
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar2;
  begin = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     comm_local);
  end = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                  ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                   comm_local);
  func.local_max = (size_t *)&local_50;
  func.prefix = (size_t *)&local_40;
  func.minqueries =
       (vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        *)local_size;
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
  foreach_pair<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::rebucket_tuples(std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>&,mxx::comm_const&,unsigned_long,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>&)::_lambda(TwoBSA<unsigned_long>const&,TwoBSA<unsigned_long>&,unsigned_long)_1_>
            ((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
              *)this,(__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                      )begin._M_current,
             (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
              )end._M_current,func,(comm *)gl_offset_local);
  iVar1 = mxx::comm::rank((comm *)gl_offset_local);
  if (iVar1 == 0) {
    uVar2 = local_40 + 1;
    pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        comm_local,0);
    pvVar3->B1 = uVar2;
    if (local_50 == 0) {
      local_50 = local_40 + 1;
    }
  }
  local_80 = mxx::exscan<unsigned_long,mxx::max<unsigned_long>>(&local_50,gl_offset_local);
  iVar1 = mxx::comm::rank((comm *)gl_offset_local);
  if (iVar1 == 0) {
    local_80 = 0;
  }
  local_90 = 0;
  while( true ) {
    if (prefix <= local_90) {
      return;
    }
    pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        comm_local,local_90);
    if (pvVar3->B1 == 0) {
      pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
               operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                          comm_local,local_90);
      pvVar3->B1 = local_80;
    }
    else {
      pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
               operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                          comm_local,local_90);
      local_80 = pvVar3->B1;
    }
    pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        comm_local,local_90);
    if (local_90 + local_40 + 1 < pvVar3->B1) break;
    bVar4 = true;
    if (local_90 != 0) {
      pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
               operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                          comm_local,local_90 - 1);
      uVar2 = pvVar3->B1;
      pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
               operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                          comm_local,local_90);
      bVar4 = true;
      if (uVar2 != pvVar3->B1) {
        pvVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)comm_local,local_90);
        bVar4 = pvVar3->B1 == local_90 + local_40 + 1;
      }
    }
    if (!bVar4) {
      __assert_fail("i == 0 || (tuples[i-1].B1 == tuples[i].B1 || tuples[i].B1 == i+prefix+1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                    ,0x4f6,
                    "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::rebucket_tuples(std::vector<TwoBSA<index_t>> &, const mxx::comm &, std::size_t, std::vector<std::tuple<index_t, index_t, index_t>> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                   );
    }
    local_90 = local_90 + 1;
  }
  __assert_fail("tuples[i].B1 <= i+prefix+1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                ,0x4f4,
                "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::rebucket_tuples(std::vector<TwoBSA<index_t>> &, const mxx::comm &, std::size_t, std::vector<std::tuple<index_t, index_t, index_t>> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
               );
}

Assistant:

void rebucket_tuples(std::vector<TwoBSA<index_t> >& tuples, const mxx::comm& comm, std::size_t gl_offset, std::vector<std::tuple<index_t, index_t, index_t> >& minqueries)
{
    /*
     * NOTE: buckets are indexed by the global index of the first element in
     *       the bucket with a ONE-BASED-INDEX (since bucket number `0` is
     *       reserved for out-of-bounds)
     */
    // inputs can be of different size, since buckets can span bucket boundaries
    std::size_t local_size = tuples.size();
    std::size_t prefix = mxx::exscan(local_size, std::plus<size_t>(), comm);
    size_t local_max = 0;
    prefix += gl_offset;

    // iterate through all pairs of elements (spanning across processors)
    foreach_pair(tuples.begin(), tuples.end(), [&](const TwoBSA<index_t>& prev, TwoBSA<index_t>& cur, size_t i){
        // if this is a new bucket boundary: set current to prefix+index and update LCP
        if (prev.B1 != cur.B1 || prev.B2 != cur.B2){
            // set every bucket boundary to its global index and other elements to
            // 0, a following max-scan will then distribute this bucket index among
            // its elements
            cur.B1 = prefix+i+1;
            local_max = cur.B1;
            if (_CONSTRUCT_LCP) {
                index_t left_b  = std::min(prev.B2, cur.B2);
                index_t right_b = std::max(prev.B2, cur.B2);
                // we need the minumum LCP of all suffixes in buckets between
                // these two buckets. Since the first element in the left bucket
                // is the LCP of this bucket with its left bucket and we don't need
                // this LCP value, start one to the right:
                // (-1 each since buffer numbers are current index + 1)
                index_t range_left = (left_b-1) + 1;
                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                minqueries.emplace_back(i + prefix, range_left, range_right);
            }
        } else {
            cur.B1 = 0;
        }
    }, comm);

    // specially handle first element of first process
    if (comm.rank() == 0) {
        tuples[0].B1 = prefix + 1;
        if (local_max == 0)
            local_max = prefix + 1;
    }

    /*
     * Global prefix MAX:
     *  - such that for every item we have it's bucket number, where the
     *    bucket number is equal to the first index in the bucket
     *    this way buckets who are finished, will never receive a new
     *    number.
     */
    // 2.) distributed scan with max() to get starting max for each sequence
    std::size_t pre_max = mxx::exscan(local_max, mxx::max<size_t>(), comm);
    if (comm.rank() == 0)
        pre_max = 0;

    // 3.) linear scan and assign bucket numbers
    for (std::size_t i = 0; i < local_size; ++i) {
        if (tuples[i].B1 == 0)
            tuples[i].B1 = pre_max;
        else
            pre_max = tuples[i].B1;
        assert(tuples[i].B1 <= i+prefix+1);
        // first element of bucket has id of it's own global index:
        assert(i == 0 || (tuples[i-1].B1 ==  tuples[i].B1 || tuples[i].B1 == i+prefix+1));
    }
}